

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O1

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_color
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,FaceHandle _fh,Vec3f *_color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_> _h;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this_00;
  reference pvVar4;
  
  _h.super_BaseHandle.idx_ =
       (BaseHandle)
       (this->mesh_->super_Mesh).
       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
       .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
       face_colors_.super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle.
       idx_;
  if (_h.super_BaseHandle.idx_ != -1) {
    fVar1 = (_color->super_VectorDataT<float,_3>).values_[0];
    fVar2 = (_color->super_VectorDataT<float,_3>).values_[1];
    fVar3 = (_color->super_VectorDataT<float,_3>).values_[2];
    this_00 = PropertyContainer::property<OpenMesh::VectorT<unsigned_char,3>>
                        ((PropertyContainer *)
                         &(this->mesh_->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .field_0x68,_h);
    pvVar4 = PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::operator[]
                       (this_00,(int)_fh.super_BaseHandle.idx_);
    (pvVar4->super_VectorDataT<unsigned_char,_3>).values_[2] = (uchar)(int)(fVar3 * 255.0 + 0.5);
    *(ushort *)(pvVar4->super_VectorDataT<unsigned_char,_3>).values_ =
         (ushort)(int)(fVar1 * 255.0 + 0.5) & 0xff |
         (ushort)(((int)(fVar2 * 255.0 + 0.5) & 0xffU) << 8);
  }
  return;
}

Assistant:

virtual void set_color(FaceHandle _fh, const Vec3f& _color)
  {
    if (mesh_.has_face_colors())
      mesh_.set_color(_fh, color_cast<Color>(_color));
  }